

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

cTValue * lj_debug_frame(lua_State *L,int level,int *size)

{
  int iVar1;
  long lVar2;
  cTValue *bot;
  cTValue *nextframe;
  cTValue *frame;
  int *size_local;
  int level_local;
  lua_State *L_local;
  
  nextframe = L->base + -1;
  frame = nextframe;
  level_local = level;
  while( true ) {
    if (frame <= (cTValue *)(ulong)(L->stack).ptr32) {
      *size = level_local;
      return (cTValue *)0x0;
    }
    if ((lua_State *)(ulong)(frame->u32).lo == L) {
      level_local = level_local + 1;
    }
    if (level_local == 0) break;
    nextframe = frame;
    if (((frame->field_2).it & 3) == 0) {
      lVar2 = (ulong)((*(uint *)((ulong)(frame->field_2).it - 4) >> 8 & 0xff) + 1) * -8;
      level_local = level_local + -1;
    }
    else {
      iVar1 = level_local + -1;
      if (((frame->field_2).it & 7) == 3) {
        iVar1 = level_local;
      }
      level_local = iVar1;
      lVar2 = -((long)(int)(frame->field_2).it & 0xfffffffffffffff8U);
    }
    frame = (cTValue *)((long)frame + lVar2);
  }
  *size = (int)((long)nextframe - (long)frame >> 3);
  return frame;
}

Assistant:

cTValue *lj_debug_frame(lua_State *L, int level, int *size)
{
  cTValue *frame, *nextframe, *bot = tvref(L->stack)+LJ_FR2;
  /* Traverse frames backwards. */
  for (nextframe = frame = L->base-1; frame > bot; ) {
    if (frame_gc(frame) == obj2gco(L))
      level++;  /* Skip dummy frames. See lj_err_optype_call(). */
    if (level-- == 0) {
      *size = (int)(nextframe - frame);
      return frame;  /* Level found. */
    }
    nextframe = frame;
    if (frame_islua(frame)) {
      frame = frame_prevl(frame);
    } else {
      if (frame_isvarg(frame))
	level++;  /* Skip vararg pseudo-frame. */
      frame = frame_prevd(frame);
    }
  }
  *size = level;
  return NULL;  /* Level not found. */
}